

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

int lyb_parse_value(lys_type *type,lyd_node_leaf_list *leaf,lyd_attr *attr,char *data,
                   unres_data *unres,lyb_state *lybs)

{
  lys_tpdf **pplVar1;
  LY_DATA_TYPE LVar2;
  LY_DATA_TYPE LVar3;
  lys_node_leaf *plVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  lys_module *plVar10;
  lys_type *plVar11;
  char *pcVar12;
  size_t sVar13;
  uint8_t *puVar14;
  lyd_val lVar15;
  lys_ident *plVar16;
  byte bVar17;
  LY_DATA_TYPE *pLVar18;
  lyd_val *plVar19;
  UNRES_ITEM type_00;
  size_t count;
  ulong uVar20;
  long lVar21;
  lyd_val *value_;
  lys_type *plVar22;
  char *pcVar23;
  ly_ctx *plVar24;
  ulong uVar25;
  lyd_val *local_a8;
  char *local_98;
  char *str;
  int local_84;
  lyd_val *local_80;
  char *local_78;
  uint64_t buf;
  lys_type *local_58;
  uint8_t *local_50;
  lyd_val *local_48;
  ly_ctx *local_40;
  byte local_35;
  uint local_34;
  uint8_t start_byte;
  
  if ((leaf != (lyd_node_leaf_list *)0x0) != (attr == (lyd_attr *)0x0)) {
    __assert_fail("(leaf || attr) && (!leaf || !attr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x2b5,
                  "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                 );
  }
  if (leaf == (lyd_node_leaf_list *)0x0) {
    local_a8 = (lyd_val *)&attr->value_str;
    local_48 = &attr->value;
    local_80 = (lyd_val *)&attr->value_type;
    local_50 = &attr->value_flags;
  }
  else {
    local_a8 = (lyd_val *)&leaf->value_str;
    local_48 = &leaf->value;
    local_80 = (lyd_val *)&leaf->value_type;
    local_50 = &leaf->value_flags;
  }
  local_40 = (ly_ctx *)lybs;
  uVar6 = lyb_read(data,&local_35,1,lybs);
  plVar24 = local_40;
  if ((int)uVar6 < 0) {
    return -1;
  }
  local_80->uint32 = local_35 & (LY_TYPE_INT32|LY_TYPE_UINT16);
  if ((char)local_35 < '\0') {
    if (leaf == (lyd_node_leaf_list *)0x0) {
      __assert_fail("leaf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x2ca,
                    "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                   );
    }
    leaf->field_0x9 = leaf->field_0x9 | 1;
  }
  if ((local_35 & 0x40) != 0) {
    *local_50 = *local_50 | 2;
  }
  if ((local_35 & 0x20) != 0) {
    *local_50 = *local_50 | 1;
  }
  pcVar23 = data + uVar6;
  LVar2 = local_80->int32;
  local_98 = (char *)0x0;
  str = (char *)leaf;
  local_58 = type;
  if ((*local_50 & 2) == 0) {
    plVar11 = type;
    if (LVar2 == LY_TYPE_ENUM) {
      LVar3 = type->base;
      while (LVar3 == LY_TYPE_LEAFREF) {
        plVar4 = (plVar11->info).lref.target;
        plVar11 = &plVar4->type;
        LVar3 = (plVar4->type).base;
      }
      uVar8 = (plVar11->info).bits.count;
      while (uVar8 == 0) {
        pplVar1 = &plVar11->der;
        plVar11 = &(*pplVar1)->type;
        uVar8 = ((*pplVar1)->type).info.bits.count;
      }
    }
    else if (LVar2 == LY_TYPE_BITS) {
      LVar3 = type->base;
      while (LVar3 == LY_TYPE_LEAFREF) {
        plVar4 = (plVar11->info).lref.target;
        plVar11 = &plVar4->type;
        LVar3 = (plVar4->type).base;
      }
      uVar8 = (plVar11->info).bits.count;
      while (uVar8 == 0) {
        pplVar1 = &plVar11->der;
        plVar11 = &(*pplVar1)->type;
        uVar8 = ((*pplVar1)->type).info.bits.count;
      }
    }
    switch(LVar2) {
    case LY_TYPE_BINARY:
    case LY_TYPE_STRING:
    case LY_TYPE_UNKNOWN:
      iVar7 = lyb_read_string(pcVar23,&local_98,0,(lyb_state *)local_40);
      if (-1 < iVar7) {
        pcVar23 = lydict_insert_zc((ly_ctx *)(plVar24->models).search_paths,local_98);
        plVar19 = local_48;
        goto LAB_001458b8;
      }
      break;
    case LY_TYPE_BITS:
      pcVar12 = (char *)calloc((ulong)(plVar11->info).bits.count,8);
      local_48->ptr = pcVar12;
      if (pcVar12 == (char *)0x0) {
        ly_log((ly_ctx *)(local_40->models).search_paths,LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","lyb_parse_val_1");
LAB_001460ba:
        iVar7 = -1;
      }
      else if ((plVar11->info).bits.count == 0) {
        iVar7 = 0;
      }
      else {
        lVar21 = 0;
        uVar25 = 0;
        iVar7 = 0;
        local_34 = uVar6;
        do {
          if ((uVar25 & 7) == 0) {
            local_84 = iVar7;
            iVar7 = lyb_read(pcVar23 + iVar7,(uint8_t *)&local_78,1,(lyb_state *)local_40);
            if (iVar7 < 0) {
              iVar7 = -1;
              uVar6 = local_34;
              break;
            }
            iVar7 = local_84 + iVar7;
          }
          if (((byte)local_78 >> (int)(uVar25 & 7) & 1) != 0) {
            *(long *)(local_48->binary + uVar25 * 8) =
                 (long)&((plVar11->info).bits.bit)->name + lVar21;
          }
          uVar25 = uVar25 + 1;
          lVar21 = lVar21 + 0x30;
          uVar6 = local_34;
        } while (uVar25 < (plVar11->info).bits.count);
      }
      break;
    case LY_TYPE_BOOL:
      iVar7 = lyb_read(pcVar23,(uint8_t *)&local_78,1,(lyb_state *)local_40);
      if ((0 < iVar7) && ((byte)local_78 != '\0')) {
        local_48->bln = '\x01';
      }
      break;
    case LY_TYPE_DEC64:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
      local_78 = (char *)0x0;
      iVar7 = lyb_read(pcVar23,(uint8_t *)&local_78,8,(lyb_state *)local_40);
      pcVar23 = local_78;
      plVar19 = local_48;
      if (iVar7 < 0) goto LAB_001460ba;
      goto LAB_001458b8;
    case LY_TYPE_EMPTY:
      iVar7 = 0;
      break;
    case LY_TYPE_ENUM:
      uVar8 = (plVar11->info).bits.count;
      count = 1;
      if ((0xff < uVar8) && (count = 2, 0xffff < uVar8)) {
        count = 4 - (ulong)(uVar8 < 0x1000000);
      }
      local_78 = (char *)0x0;
      iVar9 = lyb_read(pcVar23,(uint8_t *)&local_78,count,(lyb_state *)local_40);
      pcVar23 = (char *)0x0;
      if (-1 < iVar9) {
        pcVar23 = local_78;
      }
      iVar7 = -1;
      if (-1 < iVar9) {
        iVar7 = iVar9;
      }
      if (0 < iVar7) {
        if ((char *)(ulong)(plVar11->info).bits.count <= pcVar23) {
          __assert_fail("num < type->info.enums.count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                        ,0x1c3,
                        "int lyb_parse_val_1(struct lys_type *, LY_DATA_TYPE, uint8_t, const char *, const char **, lyd_val *, struct lyb_state *)"
                       );
        }
        local_48->binary = (char *)((plVar11->info).bits.bit + (long)pcVar23);
      }
      break;
    case LY_TYPE_IDENT:
    case LY_TYPE_INST:
    case LY_TYPE_UNION:
      goto switchD_00145815_caseD_7;
    default:
      iVar7 = -1;
      break;
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
      local_78 = (char *)0x0;
      iVar7 = lyb_read(pcVar23,(uint8_t *)&local_78,1,(lyb_state *)local_40);
      if (iVar7 < 0) goto LAB_001460ba;
      local_48->bln = (byte)local_78;
      break;
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
      local_78 = (char *)0x0;
      iVar7 = lyb_read(pcVar23,(uint8_t *)&local_78,2,(lyb_state *)local_40);
      if (iVar7 < 0) goto LAB_001460ba;
      local_48->int16 = (int16_t)local_78;
      break;
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
      local_78 = (char *)0x0;
      iVar7 = lyb_read(pcVar23,(uint8_t *)&local_78,4,(lyb_state *)local_40);
      if (iVar7 < 0) goto LAB_001460ba;
      local_48->int32 = (int32_t)local_78;
    }
  }
  else {
switchD_00145815_caseD_7:
    iVar7 = lyb_read_string(pcVar23,&local_98,0,(lyb_state *)local_40);
    if (-1 < iVar7) {
      pcVar23 = lydict_insert_zc((ly_ctx *)(plVar24->models).search_paths,local_98);
      plVar19 = local_a8;
LAB_001458b8:
      plVar19->binary = pcVar23;
    }
  }
  plVar11 = local_58;
  pcVar23 = str;
  if (iVar7 < 0) {
    return -1;
  }
  if ((local_58->base == LY_TYPE_UNION) && ((*local_50 & 2) == 0)) {
    if (local_80->int32 != LY_TYPE_STRING) {
      __assert_fail("*value_type == LY_TYPE_STRING",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x2d9,
                    "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                   );
    }
    local_a8->binary = *(char **)local_48;
    local_48->binary = (char *)0x0;
    local_80->int32 = LY_TYPE_UNION;
  }
  local_84 = iVar7;
  if (str == (char *)0x0) {
    plVar10 = attr->annotation->module;
    plVar24 = plVar10->ctx;
    plVar10 = lys_main_module(plVar10);
    plVar19 = &attr->value;
    value_ = (lyd_val *)&attr->value_str;
    puVar14 = &attr->value_flags;
    pLVar18 = &attr->value_type;
    plVar11 = local_58;
  }
  else {
    plVar24 = (*(lys_node **)str)->module->ctx;
    plVar10 = lys_node_module(*(lys_node **)str);
    plVar19 = (lyd_val *)(pcVar23 + 0x40);
    value_ = (lyd_val *)(pcVar23 + 0x38);
    puVar14 = (uint8_t *)(pcVar23 + 0x4c);
    pLVar18 = (LY_DATA_TYPE *)(pcVar23 + 0x48);
  }
  if ((*puVar14 & 2) != 0) {
    *puVar14 = *puVar14 & 0xfd;
    if (pcVar23 == (char *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (byte)pcVar23[9] & 1;
    }
    plVar11 = lyp_parse_value(local_58,&value_->binary,(lyxml_elem *)0x0,
                              (lyd_node_leaf_list *)pcVar23,attr,(lys_module *)0x0,1,uVar8,1);
    if (plVar11 != (lys_type *)0x0) {
      bVar5 = false;
      iVar7 = 0;
      if ((*puVar14 & 2) == 0) {
        bVar5 = false;
        ly_log(plVar24,LY_LLWRN,LY_SUCCESS,
               "Value \"%s\" was stored as a user type, but it is not in the current context.",
               value_);
        iVar7 = 0;
      }
      goto LAB_0014606f;
    }
    goto LAB_0014600c;
  }
  LVar2 = *pLVar18;
  LVar3 = plVar11->base;
  local_34 = uVar6;
  if ((1 < LVar3 - LY_TYPE_INST) &&
     ((LVar3 != LY_TYPE_UNION || ((plVar11->info).uni.has_ptr_type == 0)))) {
    if (LVar2 == LY_TYPE_DEC64) goto switchD_001459aa_caseD_4;
    if (LVar2 == LY_TYPE_BITS) goto switchD_001459aa_caseD_2;
    plVar22 = (lys_type *)0x0;
    goto switchD_001459aa_caseD_3;
  }
  plVar22 = (lys_type *)0x0;
  switch(LVar2) {
  case LY_TYPE_BITS:
switchD_001459aa_caseD_2:
    while (LVar3 == LY_TYPE_LEAFREF) {
      plVar4 = (plVar11->info).lref.target;
      plVar11 = &plVar4->type;
      LVar3 = (plVar4->type).base;
    }
    uVar8 = (plVar11->info).bits.count;
    while (plVar22 = plVar11, uVar8 == 0) {
      pplVar1 = &plVar11->der;
      plVar11 = &(*pplVar1)->type;
      uVar8 = ((*pplVar1)->type).info.bits.count;
    }
    break;
  case LY_TYPE_DEC64:
switchD_001459aa_caseD_4:
    plVar22 = plVar11;
    if (LVar3 == LY_TYPE_LEAFREF) {
      plVar4 = (plVar11->info).lref.target;
      if ((plVar4->type).base == LY_TYPE_LEAFREF) {
        do {
        } while( true );
      }
      plVar22 = &plVar4->type;
    }
    break;
  case LY_TYPE_IDENT:
  case LY_TYPE_INST:
  case LY_TYPE_UNION:
    goto switchD_001459aa_caseD_7;
  }
switchD_001459aa_caseD_3:
  iVar9 = -1;
  iVar7 = -1;
  bVar5 = true;
  switch(LVar2) {
  case LY_TYPE_BINARY:
  case LY_TYPE_STRING:
  case LY_TYPE_UNKNOWN:
    lVar15.ident = *(lys_ident **)plVar19;
LAB_00145ce8:
    value_->ident = (lys_ident *)lVar15;
    break;
  case LY_TYPE_BITS:
    local_80 = plVar19;
    local_48 = value_;
    local_50 = (uint8_t *)malloc(1);
    if (local_50 != (uint8_t *)0x0) {
      *local_50 = 0;
      if ((plVar22->info).bits.count != 0) {
        uVar25 = 0;
        uVar20 = 0;
        plVar19 = local_80;
        local_40 = plVar24;
        do {
          if (*(undefined8 **)(plVar19->binary + uVar25 * 8) != (undefined8 *)0x0) {
            iVar7 = (int)uVar20;
            sVar13 = strlen((char *)**(undefined8 **)(plVar19->binary + uVar25 * 8));
            puVar14 = (uint8_t *)ly_realloc(local_50,(uVar20 - (iVar7 == 0)) + sVar13 + 2);
            if (puVar14 == (uint8_t *)0x0) {
              ly_log(local_40,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_parse_val_2")
              ;
              uVar6 = local_34;
              goto LAB_0014600c;
            }
            pcVar23 = "";
            if (iVar7 != 0) {
              pcVar23 = " ";
            }
            local_50 = puVar14;
            iVar9 = sprintf((char *)(puVar14 + uVar20),"%s%s",pcVar23,
                            **(undefined8 **)(local_80->binary + uVar25 * 8));
            uVar20 = (ulong)(uint)(iVar7 + iVar9);
            plVar19 = local_80;
            plVar24 = local_40;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 < (plVar22->info).bits.count);
      }
      lVar15.binary = lydict_insert_zc(plVar24,(char *)local_50);
      value_ = local_48;
      goto LAB_00145ce8;
    }
    ly_log(plVar24,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_parse_val_2");
    goto switchD_00145ce3_caseD_9;
  case LY_TYPE_BOOL:
    pcVar23 = "true";
    if (plVar19->bln == LY_TYPE_DER) {
      pcVar23 = "false";
    }
    goto LAB_00145f01;
  case LY_TYPE_DEC64:
    uVar25 = (plVar22->info).dec64.div;
    uVar20 = (ulong)plVar19->dec64 % uVar25;
    bVar17 = (plVar22->info).dec64.dig;
    if ((1 < bVar17) && (uVar20 == ((long)uVar20 / 10) * 10)) {
      do {
        uVar20 = (long)uVar20 / 10;
        bVar17 = bVar17 - 1;
        if (bVar17 < 2) break;
      } while (uVar20 == ((long)uVar20 / 10) * 10);
    }
    sprintf((char *)&local_78,"%ld.%.*ld",plVar19->dec64 / (long)uVar25,(ulong)bVar17);
    goto LAB_00145f93;
  case LY_TYPE_EMPTY:
    pcVar23 = "";
    goto LAB_00145f01;
  case LY_TYPE_ENUM:
    pcVar23 = plVar19->enm->name;
LAB_00145f01:
    pcVar23 = lydict_insert(plVar24,pcVar23,0);
    value_->binary = pcVar23;
    break;
  case LY_TYPE_IDENT:
    if (str == (char *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (byte)str[9] & 1;
    }
    plVar16 = resolve_identref(local_58,value_->binary,(lyd_node *)str,plVar10,uVar8);
    plVar19->ident = plVar16;
    bVar5 = true;
    if (plVar16 == (lys_ident *)0x0) goto LAB_0014606f;
    break;
  case LY_TYPE_INST:
    plVar19->binary = (char *)0x0;
    break;
  default:
    goto switchD_00145ce3_caseD_9;
  case LY_TYPE_UNION:
    if (attr == (lyd_attr *)0x0) {
      iVar9 = resolve_union((lyd_node_leaf_list *)str,local_58,1,2,(lys_type **)0x0);
      bVar5 = true;
      uVar6 = local_34;
      if (iVar9 != 0) goto LAB_0014606f;
      break;
    }
    ly_log(plVar24,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
           ,0x250);
    goto switchD_00145ce3_caseD_9;
  case LY_TYPE_INT8:
    uVar25 = (ulong)(uint)(int)plVar19->bln;
    goto LAB_00145f22;
  case LY_TYPE_UINT8:
    uVar25 = (ulong)plVar19->uint8;
    goto LAB_00145f7b;
  case LY_TYPE_INT16:
    uVar25 = (ulong)(uint)(int)plVar19->int16;
    goto LAB_00145f22;
  case LY_TYPE_UINT16:
    uVar25 = (ulong)plVar19->uint16;
    goto LAB_00145f7b;
  case LY_TYPE_INT32:
    uVar25 = (ulong)plVar19->uint32;
LAB_00145f22:
    pcVar23 = "%d";
LAB_00145f82:
    sprintf((char *)&local_78,pcVar23,uVar25);
LAB_00145f93:
    pcVar23 = lydict_insert(plVar24,(char *)&local_78,0);
    value_->binary = pcVar23;
    break;
  case LY_TYPE_UINT32:
    uVar25 = (ulong)plVar19->uint32;
LAB_00145f7b:
    pcVar23 = "%u";
    goto LAB_00145f82;
  case LY_TYPE_INT64:
    pcVar23 = plVar19->binary;
    pcVar12 = "%ld";
    goto LAB_00145f65;
  case LY_TYPE_UINT64:
    pcVar23 = plVar19->binary;
    pcVar12 = "%lu";
LAB_00145f65:
    sprintf((char *)&local_78,pcVar12,pcVar23);
    goto LAB_00145f93;
  }
  plVar11 = local_58;
  if ((local_58->base - LY_TYPE_INST < 2) ||
     ((local_58->base == LY_TYPE_UNION && ((local_58->info).uni.has_ptr_type != 0)))) {
switchD_001459aa_caseD_7:
    uVar6 = local_34;
    if (value_->binary == (char *)0x0) {
      __assert_fail("*value_str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x28f,
                    "int lyb_parse_val_2(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, struct unres_data *)"
                   );
    }
    if (attr != (lyd_attr *)0x0) {
      ly_log(plVar24,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
             ,0x293);
LAB_0014600c:
      iVar7 = -1;
      bVar5 = true;
      goto LAB_0014606f;
    }
    if (plVar11->base == LY_TYPE_LEAFREF) {
      type_00 = UNRES_LEAFREF;
    }
    else if (plVar11->base == LY_TYPE_INST) {
      type_00 = UNRES_INSTID;
    }
    else {
      type_00 = UNRES_UNION;
    }
    iVar7 = unres_data_add(unres,(lyd_node *)str,type_00);
    if (iVar7 == 0) goto LAB_00146066;
    bVar5 = true;
    iVar9 = -1;
  }
  else {
LAB_00146066:
    bVar5 = false;
    iVar9 = 0;
  }
switchD_00145ce3_caseD_9:
  iVar7 = iVar9;
  uVar6 = local_34;
LAB_0014606f:
  iVar9 = -1;
  if (!bVar5) {
    iVar9 = local_84 + uVar6 + iVar7;
  }
  return iVar9;
}

Assistant:

static int
lyb_parse_value(struct lys_type *type, struct lyd_node_leaf_list *leaf, struct lyd_attr *attr, const char *data,
                struct unres_data *unres, struct lyb_state *lybs)
{
    int r, ret = 0;
    uint8_t start_byte;

    const char **value_str;
    lyd_val *value;
    LY_DATA_TYPE *value_type;
    uint8_t *value_flags;

    assert((leaf || attr) && (!leaf || !attr));

    if (leaf) {
        value_str = &leaf->value_str;
        value = &leaf->value;
        value_type = &leaf->value_type;
        value_flags = &leaf->value_flags;
    } else {
        value_str = &attr->value_str;
        value = &attr->value;
        value_type = &attr->value_type;
        value_flags = &attr->value_flags;
    }

    /* read value type and flags on the first byte */
    ret += (r = lyb_read(data, &start_byte, sizeof start_byte, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* fill value type, flags */
    *value_type = start_byte & 0x1F;
    if (start_byte & 0x80) {
        assert(leaf);
        leaf->dflt = 1;
    }
    if (start_byte & 0x40) {
        *value_flags |= LY_VALUE_USER;
    }
    if (start_byte & 0x20) {
        *value_flags |= LY_VALUE_UNRES;
    }

    ret += (r = lyb_parse_val_1(type, *value_type, *value_flags, data, value_str, value, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* union is handled specially */
    if ((type->base == LY_TYPE_UNION) && !(*value_flags & LY_VALUE_USER)) {
        assert(*value_type == LY_TYPE_STRING);

        *value_str = value->string;
        value->string = NULL;
        *value_type = LY_TYPE_UNION;
    }

    ret += (r = lyb_parse_val_2(type, leaf, attr, unres));
    LYB_HAVE_READ_RETURN(r, data, -1);

    return ret;
}